

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::CreateWaveletDisplay(Mat *waves,Mat *display,int ww,int wh)

{
  bool bVar1;
  Mat *pMVar2;
  _InputArray *p_Var3;
  uchar *puVar4;
  int local_4b8;
  int local_4b4;
  int local_45c;
  uchar *puStack_458;
  int x_3;
  uchar *destptr_3;
  uchar *srcptr_3;
  undefined1 local_440 [4];
  int y_3;
  _InputArray local_428;
  Range local_410;
  Range local_408;
  undefined1 local_400 [8];
  Mat HV;
  int local_39c;
  uchar *puStack_398;
  int x_2;
  uchar *destptr_2;
  uchar *srcptr_2;
  undefined1 local_380 [4];
  int y_2;
  _InputArray local_368;
  Range local_350;
  Range local_348;
  undefined1 local_340 [8];
  Mat VV;
  int local_2dc;
  uchar *puStack_2d8;
  int x_1;
  uchar *destptr_1;
  uchar *srcptr_1;
  undefined1 local_2c0 [4];
  int y_1;
  _InputArray local_2a8;
  Range local_290;
  Range local_288;
  undefined1 local_280 [8];
  Mat HH;
  int maxY;
  int maxX;
  int offsetY;
  int offsetX;
  int x;
  uchar *destptr;
  uchar *srcptr;
  undefined1 local_1f0 [4];
  int y;
  _InputArray local_1d8;
  double local_1c0;
  double wrange;
  double wmax;
  double wmin;
  Range local_1a0;
  Mat local_198 [96];
  Mat local_138 [8];
  Mat C;
  undefined1 local_d8 [8];
  Mat submat;
  int local_74;
  int local_70;
  int subWindowHeight;
  int subWindowWidth;
  Scalar_<double> local_60;
  _InputArray local_40;
  MatSize local_28 [8];
  int local_20;
  int local_1c;
  int wh_local;
  int ww_local;
  Mat *display_local;
  Mat *waves_local;
  
  local_20 = wh;
  local_1c = ww;
  _wh_local = (_InputArray *)display;
  display_local = waves;
  cv::MatSize::operator()(local_28);
  cv::Mat::create(display,local_28,0);
  p_Var3 = _wh_local;
  cv::Scalar_<double>::Scalar_(&local_60,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_40,(Matx<double,_4,_1> *)&local_60);
  cv::noArray();
  cv::Mat::setTo(p_Var3,&local_40);
  cv::_InputArray::~_InputArray(&local_40);
  maxX = local_1c / 2;
  maxY = local_20 / 2;
  cv::Mat::Mat((Mat *)local_d8);
  cv::Mat::Mat(local_138);
  pMVar2 = display_local;
  cv::Range::Range(&local_1a0,0,maxY);
  cv::Range::Range((Range *)&wmin,0,maxX);
  cv::Mat::operator()(local_198,(Range)pMVar2,local_1a0);
  cv::Mat::operator=((Mat *)local_d8,local_198);
  cv::Mat::~Mat(local_198);
  cv::_InputArray::_InputArray(&local_1d8,(Mat *)local_d8);
  p_Var3 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_1d8,&wmax,&wrange,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
  cv::_InputArray::~_InputArray(&local_1d8);
  local_1c0 = wrange - wmax;
  cv::_OutputArray::_OutputArray((_OutputArray *)local_1f0,local_138);
  cv::Mat::convertTo((_OutputArray *)local_d8,(int)local_1f0,255.0 / local_1c0,
                     (wmax * -255.0) / local_1c0);
  cv::_OutputArray::~_OutputArray((_OutputArray *)local_1f0);
  for (srcptr._4_4_ = 0; local_74 = maxY, local_70 = maxX, srcptr._4_4_ < maxY;
      srcptr._4_4_ = srcptr._4_4_ + 1) {
    destptr = cv::Mat::ptr<unsigned_char>(local_138,srcptr._4_4_);
    _offsetX = cv::Mat::ptr<unsigned_char>((Mat *)_wh_local,srcptr._4_4_);
    for (offsetY = 0; offsetY < maxX; offsetY = offsetY + 1) {
      *_offsetX = *destptr;
      _offsetX = _offsetX + 1;
      destptr = destptr + 1;
    }
  }
  while( true ) {
    pMVar2 = display_local;
    bVar1 = false;
    if (local_70 <= *(int *)(display_local + 0xc) / 2) {
      bVar1 = local_74 <= *(int *)(display_local + 8) / 2;
    }
    if (!bVar1) break;
    if (maxX + local_70 < *(int *)(display_local + 0xc)) {
      local_4b4 = maxX + local_70;
    }
    else {
      local_4b4 = *(int *)(display_local + 0xc);
    }
    if (maxY + local_74 < *(int *)(display_local + 8)) {
      local_4b8 = maxY + local_74;
    }
    else {
      local_4b8 = *(int *)(display_local + 8);
    }
    cv::Range::Range(&local_288,0,local_4b8);
    cv::Range::Range(&local_290,maxX,local_4b4);
    cv::Mat::operator()((Mat *)local_280,(Range)pMVar2,local_288);
    cv::_InputArray::_InputArray(&local_2a8,(Mat *)local_280);
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc(&local_2a8,&wmax,&wrange,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    cv::_InputArray::~_InputArray(&local_2a8);
    local_1c0 = wrange - wmax;
    cv::_OutputArray::_OutputArray((_OutputArray *)local_2c0,local_138);
    cv::Mat::convertTo((_OutputArray *)local_280,(int)local_2c0,255.0 / local_1c0,
                       (wmax * -255.0) / (wrange - wmax));
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_2c0);
    for (srcptr_1._4_4_ = 0; pMVar2 = display_local, srcptr_1._4_4_ < local_74;
        srcptr_1._4_4_ = srcptr_1._4_4_ + 1) {
      destptr_1 = cv::Mat::ptr<unsigned_char>(local_138,srcptr_1._4_4_);
      puVar4 = cv::Mat::ptr<unsigned_char>((Mat *)_wh_local,srcptr_1._4_4_);
      puStack_2d8 = puVar4 + maxX;
      for (local_2dc = 0; local_2dc < local_70; local_2dc = local_2dc + 1) {
        *puStack_2d8 = *destptr_1;
        puStack_2d8 = puStack_2d8 + 1;
        destptr_1 = destptr_1 + 1;
      }
    }
    cv::Range::Range(&local_348,maxY,local_4b8);
    cv::Range::Range(&local_350,0,local_4b4);
    cv::Mat::operator()((Mat *)local_340,(Range)pMVar2,local_348);
    cv::_InputArray::_InputArray(&local_368,(Mat *)local_340);
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc(&local_368,&wmax,&wrange,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    cv::_InputArray::~_InputArray(&local_368);
    local_1c0 = wrange - wmax;
    cv::_OutputArray::_OutputArray((_OutputArray *)local_380,local_138);
    cv::Mat::convertTo((_OutputArray *)local_340,(int)local_380,255.0 / local_1c0,
                       (wmax * -255.0) / (wrange - wmax));
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_380);
    for (srcptr_2._4_4_ = 0; pMVar2 = display_local, srcptr_2._4_4_ < local_74;
        srcptr_2._4_4_ = srcptr_2._4_4_ + 1) {
      destptr_2 = cv::Mat::ptr<unsigned_char>(local_138,srcptr_2._4_4_);
      puStack_398 = cv::Mat::ptr<unsigned_char>((Mat *)_wh_local,srcptr_2._4_4_ + maxY);
      for (local_39c = 0; local_39c < local_70; local_39c = local_39c + 1) {
        *puStack_398 = *destptr_2;
        puStack_398 = puStack_398 + 1;
        destptr_2 = destptr_2 + 1;
      }
    }
    cv::Range::Range(&local_408,maxY,local_4b8);
    cv::Range::Range(&local_410,maxX,local_4b4);
    cv::Mat::operator()((Mat *)local_400,(Range)pMVar2,local_408);
    cv::_InputArray::_InputArray(&local_428,(Mat *)local_400);
    p_Var3 = (_InputArray *)cv::noArray();
    cv::minMaxLoc(&local_428,&wmax,&wrange,(Point_ *)0x0,(Point_ *)0x0,p_Var3);
    cv::_InputArray::~_InputArray(&local_428);
    local_1c0 = wrange - wmax;
    cv::_OutputArray::_OutputArray((_OutputArray *)local_440,local_138);
    cv::Mat::convertTo((_OutputArray *)local_400,(int)local_440,255.0 / local_1c0,
                       (wmax * -255.0) / (wrange - wmax));
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_440);
    for (srcptr_3._4_4_ = 0; srcptr_3._4_4_ < local_74; srcptr_3._4_4_ = srcptr_3._4_4_ + 1) {
      destptr_3 = cv::Mat::ptr<unsigned_char>(local_138,srcptr_3._4_4_);
      puVar4 = cv::Mat::ptr<unsigned_char>((Mat *)_wh_local,srcptr_3._4_4_ + maxY);
      puStack_458 = puVar4 + maxX;
      for (local_45c = 0; local_45c < local_70; local_45c = local_45c + 1) {
        *puStack_458 = *destptr_3;
        puStack_458 = puStack_458 + 1;
        destptr_3 = destptr_3 + 1;
      }
    }
    maxX = local_70 + maxX;
    maxY = local_74 + maxY;
    local_70 = local_70 << 1;
    local_74 = local_74 << 1;
    cv::Mat::~Mat((Mat *)local_400);
    cv::Mat::~Mat((Mat *)local_340);
    cv::Mat::~Mat((Mat *)local_280);
  }
  cv::Mat::~Mat(local_138);
  cv::Mat::~Mat((Mat *)local_d8);
  return;
}

Assistant:

void lts2::CreateWaveletDisplay(const cv::Mat &waves, cv::Mat &display, int ww, int wh)
{
  display.create(waves.size(), CV_8U);
  display.setTo(cv::Scalar(0));
    
  // Find the continuous part first
  int subWindowWidth = ww / 2;
  int subWindowHeight = wh / 2;

  cv::Mat submat;
    
  cv::Mat C;
  submat = waves(cv::Range(0, subWindowHeight), cv::Range(0, subWindowWidth));
    
  double wmin, wmax, wrange;
  cv::minMaxLoc(submat, &wmin, &wmax);
  wrange = wmax - wmin;
    
  submat.convertTo(C, CV_8UC1, 255.0/wrange, -255.0f*wmin/wrange);
    
  for (int y = 0; y < subWindowHeight; ++y)
  {
    const uchar* srcptr = C.ptr<uchar>(y);
    uchar* destptr = display.ptr<uchar>(y);
        
    for (int x = 0; x < subWindowWidth; ++x)
      *destptr++ = *srcptr++;
  }
    
  // Now for the diff images
  int offsetX = subWindowWidth;
  int offsetY = subWindowHeight;
    
  while (subWindowWidth <= waves.cols/2 && subWindowHeight <= waves.rows/2) 
  {
    int maxX = MIN(waves.cols, offsetX + subWindowWidth);
    int maxY = MIN(waves.rows, offsetY + subWindowHeight);
        
    // HH
    cv::Mat HH = waves(cv::Range(0, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HH, &wmin, &wmax);
    wrange = wmax - wmin;
    HH.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }

    // VV
    cv::Mat VV = waves(cv::Range(offsetY, maxY), cv::Range(0, maxX));
    cv::minMaxLoc(VV, &wmin, &wmax);
    wrange = wmax - wmin;
    VV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY);
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // HV
    cv::Mat HV = waves(cv::Range(offsetY, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HV, &wmin, &wmax);
    wrange = wmax - wmin;
    HV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // Update the bounds
    offsetX += subWindowWidth;
    offsetY += subWindowHeight;
    subWindowWidth *= 2;
    subWindowHeight *= 2;
  }
}